

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

int TextEndsWithNewline(Lexer *lexer,Node *node,uint mode)

{
  uint uVar1;
  uint uVar2;
  Bool BVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  
  iVar4 = -1;
  if ((mode & 0x12) != 0) {
    BVar3 = prvTidynodeIsText(node);
    if (BVar3 != no) {
      uVar1 = node->start;
      uVar2 = node->end;
      if (uVar1 < uVar2) {
        uVar5 = uVar2;
        for (uVar6 = (ulong)(uVar2 - 1); uVar1 < (uint)uVar6; uVar6 = uVar6 - 1) {
          bVar7 = lexer->lexbuf[uVar6];
          if ((0x20 < (ulong)bVar7) || ((0x100002200U >> ((ulong)bVar7 & 0x3f) & 1) == 0))
          goto LAB_0014a077;
          uVar5 = uVar5 - 1;
        }
        bVar7 = lexer->lexbuf[uVar1];
        uVar5 = uVar1 + 1;
LAB_0014a077:
        iVar4 = -1;
        if (bVar7 == 10) {
          iVar4 = uVar2 - uVar5;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int TextEndsWithNewline(Lexer *lexer, Node *node, uint mode )
{
    if ( (mode & (CDATA|COMMENT)) && TY_(nodeIsText)(node) && node->end > node->start )
    {
        uint ch, ix = node->end - 1;
        /*\
         *  Skip non-newline whitespace. 
         *  Issue #379 - Only if ix is GT start can it be decremented!
        \*/
        while ( ix > node->start && (ch = (lexer->lexbuf[ix] & 0xff))
                 && ( ch == ' ' || ch == '\t' || ch == '\r' ) )
            --ix;

        if ( lexer->lexbuf[ ix ] == '\n' )
          return node->end - ix - 1; /* #543262 tidy eats all memory */
    }
    return -1;
}